

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  U32 length;
  uint uVar8;
  ushort *puVar9;
  ushort *puVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  int iVar13;
  BYTE *d_2;
  BYTE *pBVar14;
  ulong uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  long lVar18;
  BYTE *s;
  BYTE *d;
  BYTE *pBVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int local_50;
  BYTE *local_38;
  
  if (source == (char *)0x0) {
    source = (char *)0xffffffff;
    goto LAB_00118b3c;
  }
  lVar18 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar18 = 0;
  }
  if (originalSize == 0) {
    source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
    goto LAB_00118b3c;
  }
  pBVar1 = (BYTE *)(dest + originalSize);
  local_50 = (int)source;
  pBVar19 = (BYTE *)dest;
  if (originalSize < 0x40) goto LAB_00118ae7;
LAB_00118672:
  while( true ) {
    bVar3 = (byte)*(ushort *)source;
    uVar20 = (uint)bVar3;
    uVar8 = (uint)(bVar3 >> 4);
    if (uVar8 == 0xf) {
      uVar8 = 0;
      puVar10 = (ushort *)((long)source + 0x10);
      do {
        puVar9 = puVar10;
        uVar8 = uVar8 + *(byte *)((long)puVar9 + -0xf);
        puVar10 = (ushort *)((long)puVar9 + 1);
      } while (*(byte *)((long)puVar9 + -0xf) == 0xff);
      uVar15 = (ulong)uVar8;
      pBVar14 = pBVar19 + uVar15 + 0xf;
      source = (char *)(puVar9 + -7);
      iVar13 = 6;
      if (pBVar14 <= dest + (long)originalSize + -8) {
        do {
          *(undefined8 *)pBVar19 = *(undefined8 *)source;
          pBVar19 = pBVar19 + 8;
          source = (char *)((long)source + 8);
        } while (pBVar19 < pBVar14);
        source = (char *)((long)puVar9 + 1 + uVar15);
        iVar13 = 0;
        pBVar19 = pBVar14;
      }
      if (iVar13 != 0) {
        if (iVar13 == 6) {
          uVar15 = uVar15 + 0xf;
          goto LAB_00118990;
        }
        goto LAB_00118b3c;
      }
    }
    else {
      *(undefined8 *)pBVar19 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)((long)source + 9);
      }
      source = (char *)((byte *)((long)source + 1) + uVar8);
      pBVar19 = pBVar19 + uVar8;
    }
    pBVar14 = pBVar19;
    uVar7 = *(ushort *)source;
    uVar15 = (ulong)uVar7;
    uVar20 = (uint)uVar7;
    source = (char *)((long)source + 2);
    pBVar16 = pBVar14 + -uVar15;
    uVar22 = (ulong)(bVar3 & 0xf);
    if (uVar22 == 0xf) break;
    uVar21 = uVar22 + 4;
    if (pBVar1 + -0x40 <= pBVar14 + uVar22 + 4) goto LAB_001189ee;
    if ((pBVar16 < dest) || (uVar7 < 8)) goto LAB_0011874f;
    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar16;
    *(undefined8 *)(pBVar14 + 8) = *(undefined8 *)(pBVar16 + 8);
    *(undefined2 *)(pBVar14 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
    pBVar19 = pBVar14 + uVar22 + 4;
  }
  uVar8 = 0;
  do {
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar8 = uVar8 + (byte)uVar6;
  } while ((byte)uVar6 == 0xff);
  uVar21 = (ulong)uVar8 + 0x13;
  if (pBVar1 + -0x40 <= pBVar14 + (ulong)uVar8 + 0x13) goto LAB_001189ee;
LAB_0011874f:
  pBVar2 = pBVar14 + uVar21;
  pBVar19 = pBVar2;
  if (dest <= pBVar16) {
    if (uVar7 < 0x10) {
      LZ4_memcpy_using_offset(pBVar14,pBVar16,pBVar2,uVar15);
    }
    else {
      do {
        uVar5 = *(undefined8 *)(pBVar14 + -uVar15 + 8);
        *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar14 + -uVar15);
        *(undefined8 *)(pBVar14 + 8) = uVar5;
        uVar5 = *(undefined8 *)(pBVar14 + -uVar15 + 0x10 + 8);
        *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar14 + -uVar15 + 0x10);
        *(undefined8 *)(pBVar14 + 0x18) = uVar5;
        pBVar14 = pBVar14 + 0x20;
      } while (pBVar14 < pBVar2);
    }
    goto LAB_00118672;
  }
  if (pBVar2 <= pBVar1 + -5) {
    uVar15 = (long)dest - (long)pBVar16;
    uVar22 = uVar21 - uVar15;
    if (uVar21 < uVar15 || uVar22 == 0) {
      memmove(pBVar14,(void *)(lVar18 - uVar15),uVar21);
    }
    else {
      memcpy(pBVar14,(void *)(lVar18 - uVar15),uVar15);
      pBVar19 = pBVar14 + uVar15;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar22) {
        pBVar14 = (BYTE *)dest;
        if ((long)uVar15 < (long)uVar21) {
          do {
            *pBVar19 = *pBVar14;
            pBVar19 = pBVar19 + 1;
            pBVar14 = pBVar14 + 1;
          } while (pBVar19 < pBVar2);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar22);
        pBVar19 = pBVar2;
      }
    }
    goto LAB_00118672;
  }
  goto LAB_00118b14;
LAB_001189ee:
  pBVar2 = pBVar14 + uVar21;
  pBVar19 = pBVar2;
  if (pBVar16 < dest) {
    if (pBVar1 + -5 < pBVar2) goto LAB_00118b14;
    uVar15 = (long)dest - (long)pBVar16;
    uVar22 = uVar21 - uVar15;
    if (uVar21 < uVar15 || uVar22 == 0) {
      memmove(pBVar14,(void *)(lVar18 - uVar15),uVar21);
    }
    else {
      memcpy(pBVar14,(void *)(lVar18 - uVar15),uVar15);
      pBVar19 = pBVar14 + uVar15;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar22) {
        pBVar14 = (BYTE *)dest;
        if ((long)uVar15 < (long)uVar21) {
          do {
            *pBVar19 = *pBVar14;
            pBVar19 = pBVar19 + 1;
            pBVar14 = pBVar14 + 1;
          } while (pBVar19 < pBVar2);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar22);
        pBVar19 = pBVar2;
      }
    }
  }
  else {
    if (uVar20 < 8) {
      LZ4_decompress_fast_extDict_cold_1();
      pBVar16 = local_38;
    }
    else {
      *(undefined8 *)pBVar14 = *(undefined8 *)pBVar16;
      pBVar16 = pBVar16 + 8;
    }
    pBVar12 = pBVar14 + 8;
    if (pBVar1 + -0xc < pBVar2) {
      iVar13 = 5;
      if (pBVar2 <= pBVar1 + -5) {
        pBVar11 = pBVar1 + -7;
        pBVar14 = pBVar16;
        pBVar17 = pBVar12;
        if (pBVar12 < pBVar11) {
          do {
            *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
            pBVar17 = pBVar17 + 8;
            pBVar14 = pBVar14 + 8;
          } while (pBVar17 < pBVar11);
          pBVar16 = pBVar16 + ((long)pBVar11 - (long)pBVar12);
          pBVar12 = pBVar11;
        }
        iVar13 = 0;
        for (; pBVar12 < pBVar2; pBVar12 = pBVar12 + 1) {
          BVar4 = *pBVar16;
          pBVar16 = pBVar16 + 1;
          *pBVar12 = BVar4;
        }
      }
      if (iVar13 != 0) {
        if (iVar13 == 5) goto LAB_00118b14;
        goto LAB_00118b3c;
      }
    }
    else {
      *(undefined8 *)pBVar12 = *(undefined8 *)pBVar16;
      if (0x10 < uVar21) {
        pBVar14 = pBVar14 + 0x10;
        do {
          pBVar16 = pBVar16 + 8;
          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar16;
          pBVar14 = pBVar14 + 8;
        } while (pBVar14 < pBVar2);
      }
    }
  }
LAB_00118ae7:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar20 = (uint)bVar3;
    uVar15 = (ulong)(bVar3 >> 4);
    if ((0x8f < uVar20) || (dest + (long)originalSize + -0x1a < pBVar19)) break;
    *(undefined8 *)pBVar19 = *(undefined8 *)source;
    pBVar14 = pBVar19 + uVar15;
    uVar21 = (ulong)(uVar20 & 0xf);
    puVar10 = (ushort *)((long)source + uVar15);
    uVar22 = (ulong)*puVar10;
    pBVar16 = pBVar14 + -uVar22;
    if (((uVar20 & 0xf) == 0xf) || ((*puVar10 < 8 || (pBVar16 < dest)))) goto LAB_001189c8;
    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar16;
    *(undefined8 *)(pBVar14 + 8) = *(undefined8 *)(pBVar16 + 8);
    *(undefined2 *)(pBVar14 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
    pBVar19 = pBVar14 + uVar21 + 4;
    bVar3 = *(byte *)((long)source + uVar15 + 2);
    source = (char *)((long)source + uVar15 + 3);
  }
  if (bVar3 >> 4 == 0xf) {
    uVar8 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar15 = (ulong)uVar8 + 0xf;
  }
  pBVar14 = pBVar19 + uVar15;
LAB_00118990:
  puVar10 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pBVar14) goto LAB_00118b0d;
  do {
    *(undefined8 *)pBVar19 = *(undefined8 *)puVar10;
    pBVar19 = pBVar19 + 8;
    puVar10 = puVar10 + 4;
  } while (pBVar19 < pBVar14);
  puVar10 = (ushort *)((long)source + uVar15);
  uVar22 = (ulong)*puVar10;
  pBVar16 = pBVar14 + -uVar22;
  uVar21 = (ulong)(uVar20 & 0xf);
LAB_001189c8:
  uVar20 = (uint)uVar22;
  source = (char *)(puVar10 + 1);
  if ((int)uVar21 == 0xf) {
    uVar8 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar21 = (ulong)uVar8 + 0xf;
  }
  uVar21 = uVar21 + 4;
  goto LAB_001189ee;
LAB_00118b0d:
  if (pBVar14 == pBVar1) {
    memmove(pBVar19,source,uVar15);
    source = (char *)(ulong)(uint)(((int)source + (int)uVar15) - local_50);
    goto LAB_00118b3c;
  }
LAB_00118b14:
  source = (char *)(ulong)(~(uint)source + local_50);
LAB_00118b3c:
  return (int)source;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}